

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O0

UBool __thiscall
icu_63::TimeArrayTimeZoneRule::initStartTimes
          (TimeArrayTimeZoneRule *this,UDate *source,int32_t size,UErrorCode *status)

{
  UBool UVar1;
  UDate *pUVar2;
  UErrorCode *status_local;
  int32_t size_local;
  UDate *source_local;
  TimeArrayTimeZoneRule *this_local;
  
  if ((this->fStartTimes != (UDate *)0x0) && (this->fStartTimes != this->fLocalStartTimes)) {
    uprv_free_63(this->fStartTimes);
  }
  if (size < 0x21) {
    this->fStartTimes = this->fLocalStartTimes;
  }
  else {
    pUVar2 = (UDate *)uprv_malloc_63((long)size << 3);
    this->fStartTimes = pUVar2;
    if (this->fStartTimes == (UDate *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      this->fNumStartTimes = 0;
      return '\0';
    }
  }
  memcpy(this->fStartTimes,source,(long)size << 3);
  this->fNumStartTimes = size;
  uprv_sortArray_63(this->fStartTimes,this->fNumStartTimes,8,compareDates,(void *)0x0,'\x01',status)
  ;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    this_local._7_1_ = '\x01';
  }
  else {
    if ((this->fStartTimes != (UDate *)0x0) && (this->fStartTimes != this->fLocalStartTimes)) {
      uprv_free_63(this->fStartTimes);
    }
    this->fNumStartTimes = 0;
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool
TimeArrayTimeZoneRule::initStartTimes(const UDate source[], int32_t size, UErrorCode& status) {
    // Free old array
    if (fStartTimes != NULL && fStartTimes != fLocalStartTimes) {
        uprv_free(fStartTimes);
    }
    // Allocate new one if needed
    if (size > TIMEARRAY_STACK_BUFFER_SIZE) {
        fStartTimes = (UDate*)uprv_malloc(sizeof(UDate)*size);
        if (fStartTimes == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            fNumStartTimes = 0;
            return FALSE;
        }
    } else {
        fStartTimes = (UDate*)fLocalStartTimes;
    }
    uprv_memcpy(fStartTimes, source, sizeof(UDate)*size);
    fNumStartTimes = size;
    // Sort dates
    uprv_sortArray(fStartTimes, fNumStartTimes, (int32_t)sizeof(UDate), compareDates, NULL, TRUE, &status);
    if (U_FAILURE(status)) {
        if (fStartTimes != NULL && fStartTimes != fLocalStartTimes) {
            uprv_free(fStartTimes);
        }
        fNumStartTimes = 0;
        return FALSE;
    }
    return TRUE;
}